

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
vkt::shaderexecutor::
Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this,EvalContext *ctx)

{
  Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Expr<tcu::Vector<float,_2>_> *this_01;
  Expr<tcu::Vector<int,_2>_> *this_02;
  Expr<vkt::shaderexecutor::Void> *pEVar1;
  IArg3 local_83 [2];
  IArg2 local_81;
  IVal local_80;
  IVal local_50;
  EvalContext *local_20;
  EvalContext *ctx_local;
  Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  this_00 = this->m_func;
  local_20 = ctx;
  ctx_local = (EvalContext *)this;
  this_local = (Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                *)__return_storage_ptr__;
  this_01 = de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>::operator->
                      ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_> *)
                       &this->m_args);
  Expr<tcu::Vector<float,_2>_>::evaluate(&local_50,this_01,local_20);
  this_02 = de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>::operator->
                      ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_> *)
                       &(this->m_args).b);
  Expr<tcu::Vector<int,_2>_>::evaluate(&local_80,this_02,local_20);
  pEVar1 = de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::operator->
                     ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)
                      &(this->m_args).c);
  Expr<vkt::shaderexecutor::Void>::evaluate(pEVar1,local_20);
  pEVar1 = de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::operator->
                     ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)
                      &(this->m_args).d);
  Expr<vkt::shaderexecutor::Void>::evaluate(pEVar1,local_20);
  Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::apply(__return_storage_ptr__,this_00,ctx,&local_50,&local_80,&local_81,local_83);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}